

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Select **ppSVar7;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar3 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar3 != 0) {
        return uVar3 & 2;
      }
      iVar4 = sqlite3WalkExprList(pWalker,p->pEList);
      if (iVar4 != 0) {
        return 2;
      }
      if ((p->pWhere != (Expr *)0x0) && (iVar4 = walkExpr(pWalker,p->pWhere), iVar4 != 0)) {
        return 2;
      }
      iVar4 = sqlite3WalkExprList(pWalker,p->pGroupBy);
      if (iVar4 != 0) {
        return 2;
      }
      if ((p->pHaving != (Expr *)0x0) && (iVar4 = walkExpr(pWalker,p->pHaving), iVar4 != 0)) {
        return 2;
      }
      iVar4 = sqlite3WalkExprList(pWalker,p->pOrderBy);
      if (iVar4 != 0) {
        return 2;
      }
      if ((p->pLimit != (Expr *)0x0) && (iVar4 = walkExpr(pWalker,p->pLimit), iVar4 != 0)) {
        return 2;
      }
      if (((pWalker->pParse != (Parse *)0x0) && (1 < pWalker->pParse->eParseMode)) &&
         (iVar4 = walkWindowList(pWalker,p->pWinDefn), iVar4 != 0)) {
        return 2;
      }
      iVar4 = p->pSrc->nSrc;
      bVar2 = iVar4 < 1;
      if (0 < iVar4) {
        ppSVar7 = &p->pSrc->a[0].pSelect;
        iVar4 = iVar4 + 1;
        do {
          if (((*ppSVar7 != (Select *)0x0) &&
              (iVar5 = sqlite3WalkSelect(pWalker,*ppSVar7), iVar5 != 0)) ||
             (((*(byte *)((long)ppSVar7 + 0x15) & 4) != 0 &&
              (iVar5 = sqlite3WalkExprList(pWalker,((anon_union_8_2_996c0f8d_for_u1 *)(ppSVar7 + 7))
                                                   ->pFuncArg), iVar5 != 0)))) {
            if (!bVar2) {
              return 2;
            }
            break;
          }
          ppSVar7 = ppSVar7 + 0xe;
          iVar6 = iVar4 + -1;
          iVar5 = iVar4 + -3;
          bVar2 = iVar6 < 2;
          iVar4 = iVar6;
        } while (SBORROW4(iVar6,2) == iVar5 < 0);
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}